

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-heavy-traffic-deadlock-bug.c
# Opt level: O3

int ipc_helper_heavy_traffic_deadlock_bug(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  void *pvVar3;
  undefined8 *extraout_RDX;
  uv_pipe_t *handle;
  uv_pipe_t pipe;
  uv_pipe_t local_110;
  
  puVar2 = uv_default_loop();
  handle = &local_110;
  iVar1 = uv_pipe_init(puVar2,handle,1);
  if (iVar1 == 0) {
    handle = (uv_pipe_t *)0x0;
    iVar1 = uv_pipe_open(&local_110,0);
    if (iVar1 == 0) {
      notify_parent_process();
      do_writes_and_reads((uv_stream_t *)&local_110);
      uv_sleep(100);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      handle = (uv_pipe_t *)0x0;
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015f0f5;
    }
  }
  else {
    ipc_helper_heavy_traffic_deadlock_bug_cold_1();
  }
  ipc_helper_heavy_traffic_deadlock_bug_cold_2();
LAB_0015f0f5:
  ipc_helper_heavy_traffic_deadlock_bug_cold_3();
  pvVar3 = malloc((size_t)handle);
  *extraout_RDX = pvVar3;
  extraout_RDX[1] = (long)(int)handle;
  return (int)handle;
}

Assistant:

int ipc_helper_heavy_traffic_deadlock_bug(void) {
  uv_pipe_t pipe;
  int r;

  r = uv_pipe_init(uv_default_loop(), &pipe, 1);
  ASSERT(r == 0);
  r = uv_pipe_open(&pipe, 0);
  ASSERT(r == 0);

  notify_parent_process();
  do_writes_and_reads((uv_stream_t*) &pipe);
  uv_sleep(100);

  MAKE_VALGRIND_HAPPY();
  return 0;
}